

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNpnSave.c
# Opt level: O1

word Npn_TruthPadWord(word uTruth,int nVars)

{
  ulong uVar1;
  ulong uVar2;
  
  if (nVars != 6) {
    uVar2 = uTruth << 0x20 | uTruth & 0xffffffff;
    if (5 < nVars) {
      uVar2 = uTruth;
    }
    uVar1 = (uVar2 & 0xffff0000ffff) << 0x10 | uVar2 & 0xffff0000ffff;
    if (4 < nVars) {
      uVar1 = uVar2;
    }
    uVar2 = (uVar1 & 0xff00ff00ff00ff) << 8 | uVar1 & 0xff00ff00ff00ff;
    if (3 < nVars) {
      uVar2 = uVar1;
    }
    uVar1 = (uVar2 & 0xf0f0f0f0f0f0f0f) << 4 | uVar2 & 0xf0f0f0f0f0f0f0f;
    if (2 < nVars) {
      uVar1 = uVar2;
    }
    uVar2 = (uVar1 & 0x3333333333333333) * 5;
    if (1 < nVars) {
      uVar2 = uVar1;
    }
    uTruth = (uVar2 & 0x5555555555555555) * 3;
    if (nVars != 0) {
      uTruth = uVar2;
    }
  }
  return uTruth;
}

Assistant:

word Npn_TruthPadWord( word uTruth, int nVars )
{
    if ( nVars == 6 )
        return uTruth;
    if ( nVars <= 5 )
        uTruth = ((uTruth & ABC_CONST(0x00000000FFFFFFFF)) << 32) | (uTruth & ABC_CONST(0x00000000FFFFFFFF));
    if ( nVars <= 4 )
        uTruth = ((uTruth & ABC_CONST(0x0000FFFF0000FFFF)) << 16) | (uTruth & ABC_CONST(0x0000FFFF0000FFFF));
    if ( nVars <= 3 )
        uTruth = ((uTruth & ABC_CONST(0x00FF00FF00FF00FF)) <<  8) | (uTruth & ABC_CONST(0x00FF00FF00FF00FF));
    if ( nVars <= 2 )
        uTruth = ((uTruth & ABC_CONST(0x0F0F0F0F0F0F0F0F)) <<  4) | (uTruth & ABC_CONST(0x0F0F0F0F0F0F0F0F));
    if ( nVars <= 1 )
        uTruth = ((uTruth & ABC_CONST(0x3333333333333333)) <<  2) | (uTruth & ABC_CONST(0x3333333333333333));
    if ( nVars == 0 )
        uTruth = ((uTruth & ABC_CONST(0x5555555555555555)) <<  1) | (uTruth & ABC_CONST(0x5555555555555555));
    return uTruth;
}